

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearraymatcher.cpp
# Opt level: O2

void __thiscall
QByteArrayMatcher::QByteArrayMatcher(QByteArrayMatcher *this,char *pattern,qsizetype length)

{
  (this->q_pattern).d.ptr = (char *)0x0;
  (this->q_pattern).d.size = 0;
  this->d = (QByteArrayMatcherPrivate *)0x0;
  (this->q_pattern).d.d = (Data *)0x0;
  (this->field_2).p.p = (uchar *)pattern;
  if (length < 0) {
    length = qstrlen(pattern);
    pattern = (char *)(this->field_2).p.p;
  }
  (this->field_2).p.l = length;
  bm_init_skiptable((uchar *)pattern,length,(uchar *)(this->field_2).dummy);
  return;
}

Assistant:

QByteArrayMatcher::QByteArrayMatcher(const char *pattern, qsizetype length) : d(nullptr)
{
    p.p = reinterpret_cast<const uchar *>(pattern);
    if (length < 0)
        p.l = qstrlen(pattern);
    else
        p.l = length;
    bm_init_skiptable(p.p, p.l, p.q_skiptable);
}